

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * duckdb_fmt::v6::internal::
       parse_arg_id<char,duckdb_fmt::v6::internal::precision_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,duckdb_fmt::v6::internal::error_handler>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>&,char>>
                 (char *begin,char *end,
                 precision_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
                 *handler)

{
  basic_string_view<char> id;
  bool bVar1;
  char *pcVar2;
  type count;
  precision_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
  *in_RDX;
  char *in_RSI;
  char *in_RDI;
  char *it;
  int index;
  char c;
  undefined8 in_stack_ffffffffffffff28;
  precision_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
  *in_stack_ffffffffffffff30;
  undefined5 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3d;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 uVar3;
  size_t in_stack_ffffffffffffff40;
  string *in_stack_ffffffffffffff68;
  precision_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
  *in_stack_ffffffffffffff70;
  precision_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
  *in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  char **in_stack_ffffffffffffff88;
  allocator local_49;
  string local_48 [32];
  int local_28;
  char local_21;
  precision_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
  *local_20;
  char *local_18;
  char *local_10;
  char *local_8;
  
  local_21 = *in_RDI;
  local_10 = in_RDI;
  if ((local_21 == '}') || (local_21 == ':')) {
    precision_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
    ::operator()(in_stack_ffffffffffffff30);
    local_8 = local_10;
  }
  else {
    local_18 = in_RSI;
    if ((local_21 < '0') || ('9' < local_21)) {
      local_20 = in_RDX;
      bVar1 = is_name_start<char>(local_21);
      pcVar2 = local_10;
      if (bVar1) {
        do {
          pcVar2 = pcVar2 + 1;
          uVar3 = false;
          if (pcVar2 != local_18) {
            local_21 = *pcVar2;
            bVar1 = is_name_start<char>(local_21);
            in_stack_ffffffffffffff3e = true;
            uVar3 = true;
            if (!bVar1) {
              in_stack_ffffffffffffff3d = '/' < local_21 && local_21 < ':';
              in_stack_ffffffffffffff3e = in_stack_ffffffffffffff3d;
              uVar3 = in_stack_ffffffffffffff3d;
            }
          }
        } while ((bool)uVar3 != false);
        count = to_unsigned<long>((long)pcVar2 - (long)local_10);
        basic_string_view<char>::basic_string_view
                  ((basic_string_view<char> *)&stack0xffffffffffffff60,local_10,count);
        id.data_._5_1_ = in_stack_ffffffffffffff3d;
        id.data_._0_5_ = in_stack_ffffffffffffff38;
        id.data_._6_1_ = in_stack_ffffffffffffff3e;
        id.data_._7_1_ = uVar3;
        id.size_ = in_stack_ffffffffffffff40;
        precision_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
        ::operator()(local_20,id);
        local_8 = pcVar2;
      }
      else {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&stack0xffffffffffffff80,"invalid format string",
                   (allocator *)&stack0xffffffffffffff7f);
        precision_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
        ::on_error(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff7f);
        local_8 = local_10;
      }
    }
    else {
      local_28 = parse_nonnegative_int<char,duckdb_fmt::v6::internal::precision_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,duckdb_fmt::v6::internal::error_handler>,duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>>,char>>>&,char>&>
                           (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                            in_stack_ffffffffffffff78);
      if ((local_10 == local_18) || ((*local_10 != '}' && (*local_10 != ':')))) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_48,"invalid format string",&local_49);
        precision_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
        ::on_error(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
        std::__cxx11::string::~string(local_48);
        std::allocator<char>::~allocator((allocator<char> *)&local_49);
      }
      else {
        precision_adapter<duckdb_fmt::v6::internal::specs_checker<duckdb_fmt::v6::internal::specs_handler<duckdb_fmt::v6::basic_format_parse_context<char,_duckdb_fmt::v6::internal::error_handler>,_duckdb_fmt::v6::basic_format_context<std::back_insert_iterator<duckdb_fmt::v6::internal::buffer<char>_>,_char>_>_>_&,_char>
        ::operator()(in_stack_ffffffffffffff30,(int)((ulong)in_stack_ffffffffffffff28 >> 0x20));
      }
      local_8 = local_10;
    }
  }
  return local_8;
}

Assistant:

FMT_CONSTEXPR const Char* parse_arg_id(const Char* begin, const Char* end,
                                       IDHandler&& handler) {
  FMT_ASSERT(begin != end, "");
  Char c = *begin;
  if (c == '}' || c == ':') {
    handler();
    return begin;
  }
  if (c >= '0' && c <= '9') {
    int index = parse_nonnegative_int(begin, end, handler);
    if (begin == end || (*begin != '}' && *begin != ':'))
      handler.on_error("invalid format string");
    else
      handler(index);
    return begin;
  }
  if (!is_name_start(c)) {
    handler.on_error("invalid format string");
    return begin;
  }
  auto it = begin;
  do {
    ++it;
  } while (it != end && (is_name_start(c = *it) || ('0' <= c && c <= '9')));
  handler(basic_string_view<Char>(begin, to_unsigned(it - begin)));
  return it;
}